

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void embree::SceneGraph::store
               (Ref<embree::SceneGraph::Node> *root,FileName *filename,bool embedTextures,
               bool referenceMaterials,bool binaryFormat)

{
  __type _Var1;
  runtime_error *this;
  undefined7 in_register_00000011;
  allocator local_a9;
  Ref<embree::SceneGraph::Node> local_a8;
  undefined4 local_9c;
  Ref<embree::SceneGraph::Node> *local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_9c = (undefined4)CONCAT71(in_register_00000011,embedTextures);
  local_98 = root;
  FileName::ext_abi_cxx11_(&local_90,filename);
  toLowerCase(&local_70,&local_90);
  std::__cxx11::string::string((string *)&local_50,"xml",&local_a9);
  _Var1 = std::operator==(&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  if (_Var1) {
    local_a8.ptr = local_98->ptr;
    if (local_a8.ptr != (Node *)0x0) {
      (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    storeXML(&local_a8,filename,local_9c._0_1_,referenceMaterials,binaryFormat);
    if (local_a8.ptr != (Node *)0x0) {
      (*((local_a8.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  FileName::ext_abi_cxx11_(&local_90,filename);
  std::operator+(&local_70,"unknown scene format: ",&local_90);
  std::runtime_error::runtime_error(this,(string *)&local_70);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SceneGraph::store(Ref<SceneGraph::Node> root, const FileName& filename, bool embedTextures, bool referenceMaterials, bool binaryFormat)
  {
    if (toLowerCase(filename.ext()) == std::string("xml")) {
      storeXML(root,filename,embedTextures,referenceMaterials,binaryFormat);
    }
    else
      throw std::runtime_error("unknown scene format: " + filename.ext());
  }